

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * ghc::filesystem::relative(path *__return_storage_ptr__,path *p,error_code *ec)

{
  path local_40;
  
  current_path(&local_40,ec);
  relative(__return_storage_ptr__,p,&local_40,ec);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._path._M_dataplus._M_p != &local_40._path.field_2) {
    operator_delete(local_40._path._M_dataplus._M_p,local_40._path.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path relative(const path& p, std::error_code& ec)
{
    return relative(p, current_path(ec), ec);
}